

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_compressBlock_fast_extDict_generic
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize,
                 U32 mls,U32 hasStep)

{
  uint *ilimit_w;
  uint *iEnd;
  BYTE *iStart;
  uint *puVar1;
  uint *puVar2;
  undefined8 *puVar3;
  BYTE *pBVar4;
  U32 *pUVar5;
  BYTE *pBVar6;
  seqDef *psVar7;
  uint uVar8;
  undefined8 uVar9;
  int iVar10;
  bool bVar11;
  char cVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint *puVar18;
  size_t sVar19;
  byte bVar20;
  uint uVar21;
  ulong uVar22;
  long lVar23;
  uint *iend;
  uint *ip;
  uint uVar24;
  ulong uVar25;
  ulong uVar26;
  BYTE *pBVar27;
  int iVar28;
  ulong uVar29;
  uint *puVar30;
  uint *puVar31;
  uint uVar32;
  ulong uVar33;
  ulong uVar34;
  uint *puVar35;
  BYTE *pBVar36;
  int iVar37;
  uint uVar38;
  U32 UVar39;
  uint *puVar40;
  uint *puVar41;
  uint local_178;
  ulong local_150;
  U32 local_12c;
  uint *local_108;
  BYTE *local_c8;
  
  uVar17 = (ms->cParams).targetLength;
  uVar34 = (ulong)(uVar17 + 1 + (uint)(uVar17 == 0));
  pBVar4 = (ms->window).base;
  iVar10 = (int)pBVar4;
  iVar28 = (int)src - iVar10;
  iVar37 = (int)srcSize + iVar28;
  uVar15 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  uVar17 = (ms->window).lowLimit;
  uVar8 = iVar37 - uVar15;
  if (iVar37 - uVar17 <= uVar15) {
    uVar8 = uVar17;
  }
  if (ms->loadedDictEnd != 0) {
    uVar8 = uVar17;
  }
  uVar17 = (ms->window).dictLimit;
  if (uVar17 <= uVar8) {
    sVar19 = ZSTD_compressBlock_fast(ms,seqStore,rep,src,srcSize);
    return sVar19;
  }
  iEnd = (uint *)((long)src + srcSize);
  puVar30 = (uint *)((long)src + (srcSize - 8));
  uVar15 = *rep;
  uVar21 = rep[1];
  uVar32 = iVar28 - uVar8;
  local_178 = uVar21;
  uVar14 = 0;
  if (uVar32 <= uVar21) {
    local_178 = 0;
    uVar14 = uVar21;
  }
  uVar13 = uVar15;
  uVar21 = 0;
  if (uVar15 < uVar32) {
    uVar13 = 0;
    uVar21 = uVar15;
  }
  puVar40 = (uint *)((long)src + uVar34 + 1);
  ip = (uint *)src;
  if (puVar40 < puVar30) {
    uVar15 = (ms->cParams).hashLog;
    if (0x20 < uVar15) {
      __assert_fail("hBits <= 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x4730,"size_t ZSTD_hashPtr(const void *, U32, U32)");
    }
    cVar12 = (char)uVar15;
    bVar20 = 0x40 - cVar12;
    pUVar5 = ms->hashTable;
    pBVar6 = (ms->window).dictBase;
    iStart = pBVar4 + uVar17;
    puVar1 = (uint *)(pBVar6 + uVar17);
    puVar35 = (uint *)((long)src + uVar34);
    ilimit_w = iEnd + -8;
    local_108 = (uint *)0x0;
    do {
      uVar15 = mls - 5;
      uVar26 = (ulong)uVar15;
      switch(uVar26) {
      case 0:
        lVar23 = -0x30e4432345000000;
        break;
      case 1:
        lVar23 = -0x30e4432340650000;
        break;
      case 2:
        lVar23 = -0x30e44323405a9d00;
        break;
      case 3:
        uVar29 = *(long *)ip * -0x30e44323485a9b9d;
        goto LAB_0019b32d;
      default:
        uVar29 = (ulong)(*ip * -0x61c8864f >> (0x20U - cVar12 & 0x1f));
        goto LAB_0019b335;
      }
      uVar29 = lVar23 * *(long *)ip;
LAB_0019b32d:
      uVar29 = uVar29 >> (bVar20 & 0x3f);
LAB_0019b335:
      puVar31 = (uint *)((long)ip + 1);
      switch(uVar26) {
      case 0:
        lVar23 = -0x30e4432345000000;
        break;
      case 1:
        lVar23 = -0x30e4432340650000;
        break;
      case 2:
        lVar23 = -0x30e44323405a9d00;
        break;
      case 3:
        uVar25 = *(long *)puVar31 * -0x30e44323485a9b9d;
        goto LAB_0019b3b3;
      default:
        uVar25 = (ulong)(*puVar31 * -0x61c8864f >> (0x20U - cVar12 & 0x1f));
        goto LAB_0019b3bb;
      }
      uVar25 = lVar23 * *(long *)puVar31;
LAB_0019b3b3:
      uVar25 = uVar25 >> (bVar20 & 0x3f);
LAB_0019b3bb:
      puVar18 = ip + 0x20;
      uVar32 = pUVar5[uVar29];
      iend = ip;
      pBVar27 = pBVar4;
      uVar33 = uVar34;
      if (uVar32 < uVar17) {
        pBVar27 = pBVar6;
      }
      while( true ) {
        uVar22 = (ulong)uVar32;
        uVar24 = ((int)puVar35 - iVar10) - uVar21;
        pBVar36 = pBVar4;
        if (uVar24 < uVar17) {
          pBVar36 = pBVar6;
        }
        if ((uVar21 == 0) || (uVar17 - uVar24 < 4)) {
          uVar16 = *puVar35 ^ 1;
        }
        else {
          uVar16 = *(uint *)(pBVar36 + uVar24);
        }
        uVar38 = (int)iend - iVar10;
        pUVar5[uVar29] = uVar38;
        iVar28 = 0;
        if (*puVar35 == uVar16) {
          pBVar36 = pBVar36 + uVar24;
          if ((pBVar36 == iStart) || (pBVar36 == pBVar6 + uVar8)) {
            __assert_fail("(match0 != prefixStart) & (match0 != dictStart)",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x72c6,
                          "size_t ZSTD_compressBlock_fast_extDict_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
                         );
          }
          local_108 = iEnd;
          if (uVar24 < uVar17) {
            local_108 = puVar1;
          }
          uVar29 = (ulong)(*(BYTE *)((long)puVar35 + -1) == pBVar36[-1]);
          iend = (uint *)((long)puVar35 - uVar29);
          local_c8 = pBVar36 + -uVar29;
          local_150 = uVar29 | 4;
          iVar28 = 6;
          local_12c = 1;
        }
        uVar29 = uVar25;
        if (iVar28 != 0) {
          uVar32 = uVar21;
          if (iVar28 != 6) {
            return (size_t)puVar40;
          }
          goto LAB_0019b778;
        }
        if (uVar32 < uVar8) {
          uVar32 = *iend ^ 1;
        }
        else {
          uVar32 = *(uint *)(pBVar27 + uVar22);
        }
        if (*iend == uVar32) break;
        uVar32 = pUVar5[uVar25];
        uVar22 = (ulong)uVar32;
        pBVar27 = pBVar4;
        if (uVar32 < uVar17) {
          pBVar27 = pBVar6;
        }
        switch(uVar26) {
        case 0:
          lVar23 = -0x30e4432345000000;
          break;
        case 1:
          lVar23 = -0x30e4432340650000;
          break;
        case 2:
          lVar23 = -0x30e44323405a9d00;
          break;
        case 3:
          uVar29 = *(long *)puVar35 * -0x30e44323485a9b9d;
          goto LAB_0019b55d;
        default:
          uVar29 = (ulong)(*puVar35 * -0x61c8864f >> (0x20U - cVar12 & 0x1f));
          goto LAB_0019b565;
        }
        uVar29 = lVar23 * *(long *)puVar35;
LAB_0019b55d:
        uVar29 = uVar29 >> (bVar20 & 0x3f);
LAB_0019b565:
        uVar38 = (int)puVar31 - iVar10;
        pUVar5[uVar25] = uVar38;
        if (uVar32 < uVar8) {
          uVar32 = *puVar31 ^ 1;
        }
        else {
          uVar32 = *(uint *)(pBVar27 + uVar22);
        }
        uVar24 = *puVar31;
        iend = puVar31;
        puVar31 = puVar35;
        if (uVar24 == uVar32) break;
        uVar32 = pUVar5[uVar29];
        pBVar27 = pBVar4;
        if (uVar32 < uVar17) {
          pBVar27 = pBVar6;
        }
        switch(uVar26) {
        case 0:
          lVar23 = -0x30e4432345000000;
          break;
        case 1:
          lVar23 = -0x30e4432340650000;
          break;
        case 2:
          lVar23 = -0x30e44323405a9d00;
          break;
        case 3:
          uVar25 = *(long *)puVar40 * -0x30e44323485a9b9d;
          goto LAB_0019b614;
        default:
          uVar25 = (ulong)(*puVar40 * -0x61c8864f >> (0x20U - cVar12 & 0x1f));
          goto LAB_0019b61c;
        }
        uVar25 = lVar23 * *(long *)puVar40;
LAB_0019b614:
        uVar25 = uVar25 >> (bVar20 & 0x3f);
LAB_0019b61c:
        puVar2 = (uint *)(uVar33 + (long)puVar35);
        uVar22 = uVar33;
        if (puVar18 <= puVar2) {
          puVar18 = puVar18 + 0x20;
          uVar22 = uVar33 + 1;
        }
        puVar41 = (uint *)(uVar33 + (long)puVar40);
        iend = puVar35;
        puVar31 = puVar40;
        uVar33 = uVar22;
        puVar35 = puVar2;
        puVar40 = puVar41;
        if (puVar30 <= puVar41) goto LAB_0019bd5c;
      }
      local_108 = iEnd;
      pBVar36 = iStart;
      if ((uint)uVar22 < uVar17) {
        local_108 = puVar1;
        pBVar36 = pBVar6 + uVar8;
      }
      uVar32 = uVar38 - (uint)uVar22;
      if (uVar32 == 0) {
        __assert_fail("(offset)>0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x7326,
                      "size_t ZSTD_compressBlock_fast_extDict_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
                     );
      }
      local_c8 = pBVar27 + uVar22;
      local_12c = uVar32 + 3;
      local_150 = 4;
      local_178 = uVar21;
      if ((pBVar36 < local_c8) && (ip < iend)) {
        local_c8 = pBVar27 + uVar22;
        do {
          puVar40 = (uint *)((long)iend + -1);
          pBVar27 = local_c8 + -1;
          if ((*(BYTE *)puVar40 != *pBVar27) ||
             (local_150 = local_150 + 1, iend = puVar40, local_c8 = pBVar27, pBVar27 <= pBVar36))
          break;
        } while (ip < puVar40);
      }
LAB_0019b778:
      if (local_108 == (uint *)0x0) {
        __assert_fail("matchEnd != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x7333,
                      "size_t ZSTD_compressBlock_fast_extDict_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
                     );
      }
      sVar19 = ZSTD_count_2segments
                         ((BYTE *)((long)iend + local_150),local_c8 + local_150,(BYTE *)iEnd,
                          (BYTE *)local_108,iStart);
      if (seqStore->maxNbSeq <=
          (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
LAB_0019bdc5:
        __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x468b,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (0x20000 < seqStore->maxNbLit) {
LAB_0019be41:
        __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x468d,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      uVar25 = (long)iend - (long)ip;
      pBVar27 = seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < pBVar27 + uVar25) {
LAB_0019bde4:
        __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x468e,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (iEnd < iend) {
LAB_0019be03:
        __assert_fail("literals + litLength <= litLimit",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x468f,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (ilimit_w < iend) {
        ZSTD_safecopyLiterals(pBVar27,(BYTE *)ip,(BYTE *)iend,(BYTE *)ilimit_w);
      }
      else {
        uVar9 = *(undefined8 *)(ip + 2);
        *(undefined8 *)pBVar27 = *(undefined8 *)ip;
        *(undefined8 *)(pBVar27 + 8) = uVar9;
        if (0x10 < uVar25) {
          pBVar27 = seqStore->lit;
          if ((BYTE *)0xffffffffffffffe0 < pBVar27 + 0x10 + (-0x10 - (long)(ip + 4))) {
            __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x36a6,
                          "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                         );
          }
          uVar9 = *(undefined8 *)(ip + 6);
          *(undefined8 *)(pBVar27 + 0x10) = *(undefined8 *)(ip + 4);
          *(undefined8 *)(pBVar27 + 0x18) = uVar9;
          if (0x20 < (long)uVar25) {
            lVar23 = 0;
            do {
              puVar3 = (undefined8 *)((long)ip + lVar23 + 0x20);
              uVar9 = puVar3[1];
              pBVar36 = pBVar27 + lVar23 + 0x20;
              *(undefined8 *)pBVar36 = *puVar3;
              *(undefined8 *)(pBVar36 + 8) = uVar9;
              puVar3 = (undefined8 *)((long)ip + lVar23 + 0x30);
              uVar9 = puVar3[1];
              *(undefined8 *)(pBVar36 + 0x10) = *puVar3;
              *(undefined8 *)(pBVar36 + 0x18) = uVar9;
              lVar23 = lVar23 + 0x20;
            } while (pBVar36 + 0x20 < pBVar27 + uVar25);
          }
        }
      }
      seqStore->lit = seqStore->lit + uVar25;
      if (0xffff < uVar25) {
        if (seqStore->longLengthType != ZSTD_llt_none) {
          __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x46a0,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        seqStore->longLengthType = ZSTD_llt_literalLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
      }
      local_150 = sVar19 + local_150;
      psVar7 = seqStore->sequences;
      psVar7->litLength = (U16)uVar25;
      psVar7->offBase = local_12c;
      if (local_150 < 3) {
LAB_0019be22:
        __assert_fail("matchLength >= MINMATCH",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x46aa,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (0xffff < local_150 - 3) {
        if (seqStore->longLengthType != ZSTD_llt_none) {
LAB_0019be60:
          __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x46ad,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos = (U32)((ulong)((long)psVar7 - (long)seqStore->sequencesStart) >> 3)
        ;
      }
      psVar7->mlBase = (U16)(local_150 - 3);
      seqStore->sequences = psVar7 + 1;
      ip = (uint *)((long)iend + local_150);
      if (puVar31 < ip) {
        pUVar5[uVar29] = (int)puVar31 - iVar10;
      }
      uVar21 = uVar32;
      if (ip <= puVar30) {
        if (pBVar4 + (ulong)uVar38 + 2 <= src) {
          __assert_fail("base+current0+2 > istart",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x7343,
                        "size_t ZSTD_compressBlock_fast_extDict_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
                       );
        }
        if (uVar15 < 4) {
          sVar19 = (*(code *)(&DAT_0026c3f4 + *(int *)(&DAT_0026c3f4 + uVar26 * 4)))();
          return sVar19;
        }
        pUVar5[(uint)(*(int *)(pBVar4 + (ulong)uVar38 + 2) * -0x61c8864f) >> (0x20U - cVar12 & 0x1f)
              ] = uVar38 + 2;
        if (uVar15 < 4) {
          sVar19 = (*(code *)(&DAT_0026c404 + *(int *)(&DAT_0026c404 + uVar26 * 4)))();
          return sVar19;
        }
        pUVar5[(uint)(*(int *)((long)ip + -2) * -0x61c8864f) >> (0x20U - cVar12 & 0x1f)] =
             (int)(int *)((long)ip + -2) - iVar10;
        do {
          uVar21 = uVar32;
          if (puVar30 < ip) break;
          UVar39 = (int)ip - iVar10;
          uVar21 = UVar39 - local_178;
          pBVar27 = pBVar4;
          if (uVar21 < uVar17) {
            pBVar27 = pBVar6;
          }
          if (((local_178 == 0) || (0xfffffffc < uVar21 - uVar17)) ||
             (*(uint *)(pBVar27 + uVar21) != *ip)) {
            bVar11 = false;
            uVar21 = local_178;
          }
          else {
            puVar40 = iEnd;
            if (uVar21 < uVar17) {
              puVar40 = puVar1;
            }
            sVar19 = ZSTD_count_2segments
                               ((BYTE *)(ip + 1),(BYTE *)((long)(pBVar27 + uVar21) + 4),(BYTE *)iEnd
                                ,(BYTE *)puVar40,iStart);
            if (seqStore->maxNbSeq <=
                (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
            goto LAB_0019bdc5;
            if (0x20000 < seqStore->maxNbLit) goto LAB_0019be41;
            puVar40 = (uint *)seqStore->lit;
            if (seqStore->litStart + seqStore->maxNbLit < puVar40) goto LAB_0019bde4;
            if (iEnd < ip) goto LAB_0019be03;
            if (ilimit_w < ip) {
              ZSTD_safecopyLiterals((BYTE *)puVar40,(BYTE *)ip,(BYTE *)ip,(BYTE *)ilimit_w);
            }
            else {
              uVar21 = ip[1];
              uVar24 = ip[2];
              uVar16 = ip[3];
              *puVar40 = *ip;
              puVar40[1] = uVar21;
              puVar40[2] = uVar24;
              puVar40[3] = uVar16;
            }
            psVar7 = seqStore->sequences;
            psVar7->litLength = 0;
            psVar7->offBase = 1;
            if (sVar19 + 4 < 3) goto LAB_0019be22;
            if (0xffff < sVar19 + 1) {
              if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_0019be60;
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar7 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar7->mlBase = (U16)(sVar19 + 1);
            seqStore->sequences = psVar7 + 1;
            if (uVar15 < 4) {
              sVar19 = (*(code *)(&DAT_0026c414 + *(int *)(&DAT_0026c414 + uVar26 * 4)))();
              return sVar19;
            }
            pUVar5[*ip * -0x61c8864f >> (0x20U - cVar12 & 0x1f)] = UVar39;
            ip = (uint *)((long)ip + sVar19 + 4);
            bVar11 = true;
            uVar21 = uVar32;
            uVar32 = local_178;
          }
          local_178 = uVar21;
          uVar21 = uVar32;
        } while (bVar11);
      }
      puVar35 = (uint *)((long)ip + uVar34);
      puVar40 = (uint *)((long)ip + uVar34 + 1);
    } while (puVar40 < puVar30);
  }
LAB_0019bd5c:
  uVar17 = uVar13;
  if (uVar21 == 0) {
    uVar21 = uVar13;
    uVar17 = uVar14;
  }
  if (uVar13 == 0) {
    uVar17 = uVar14;
  }
  *rep = uVar21;
  if (local_178 != 0) {
    uVar17 = local_178;
  }
  rep[1] = uVar17;
  return (long)iEnd - (long)ip;
}

Assistant:

static size_t ZSTD_compressBlock_fast_extDict_generic(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize, U32 const mls, U32 const hasStep)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    U32* const hashTable = ms->hashTable;
    U32 const hlog = cParams->hashLog;
    /* support stepSize of 0 */
    size_t const stepSize = cParams->targetLength + !(cParams->targetLength) + 1;
    const BYTE* const base = ms->window.base;
    const BYTE* const dictBase = ms->window.dictBase;
    const BYTE* const istart = (const BYTE*)src;
    const BYTE* anchor = istart;
    const U32   endIndex = (U32)((size_t)(istart - base) + srcSize);
    const U32   lowLimit = ZSTD_getLowestMatchIndex(ms, endIndex, cParams->windowLog);
    const U32   dictStartIndex = lowLimit;
    const BYTE* const dictStart = dictBase + dictStartIndex;
    const U32   dictLimit = ms->window.dictLimit;
    const U32   prefixStartIndex = dictLimit < lowLimit ? lowLimit : dictLimit;
    const BYTE* const prefixStart = base + prefixStartIndex;
    const BYTE* const dictEnd = dictBase + prefixStartIndex;
    const BYTE* const iend = istart + srcSize;
    const BYTE* const ilimit = iend - 8;
    U32 offset_1=rep[0], offset_2=rep[1];
    U32 offsetSaved1 = 0, offsetSaved2 = 0;

    const BYTE* ip0 = istart;
    const BYTE* ip1;
    const BYTE* ip2;
    const BYTE* ip3;
    U32 current0;


    size_t hash0; /* hash for ip0 */
    size_t hash1; /* hash for ip1 */
    U32 idx; /* match idx for ip0 */
    const BYTE* idxBase; /* base pointer for idx */

    U32 offcode;
    const BYTE* match0;
    size_t mLength;
    const BYTE* matchEnd = 0; /* initialize to avoid warning, assert != 0 later */

    size_t step;
    const BYTE* nextStep;
    const size_t kStepIncr = (1 << (kSearchStrength - 1));

    (void)hasStep; /* not currently specialized on whether it's accelerated */

    DEBUGLOG(5, "ZSTD_compressBlock_fast_extDict_generic (offset_1=%u)", offset_1);

    /* switch to "regular" variant if extDict is invalidated due to maxDistance */
    if (prefixStartIndex == dictStartIndex)
        return ZSTD_compressBlock_fast(ms, seqStore, rep, src, srcSize);

    {   U32 const curr = (U32)(ip0 - base);
        U32 const maxRep = curr - dictStartIndex;
        if (offset_2 >= maxRep) offsetSaved2 = offset_2, offset_2 = 0;
        if (offset_1 >= maxRep) offsetSaved1 = offset_1, offset_1 = 0;
    }

    /* start each op */
_start: /* Requires: ip0 */

    step = stepSize;
    nextStep = ip0 + kStepIncr;

    /* calculate positions, ip0 - anchor == 0, so we skip step calc */
    ip1 = ip0 + 1;
    ip2 = ip0 + step;
    ip3 = ip2 + 1;

    if (ip3 >= ilimit) {
        goto _cleanup;
    }

    hash0 = ZSTD_hashPtr(ip0, hlog, mls);
    hash1 = ZSTD_hashPtr(ip1, hlog, mls);

    idx = hashTable[hash0];
    idxBase = idx < prefixStartIndex ? dictBase : base;

    do {
        {   /* load repcode match for ip[2] */
            U32 const current2 = (U32)(ip2 - base);
            U32 const repIndex = current2 - offset_1;
            const BYTE* const repBase = repIndex < prefixStartIndex ? dictBase : base;
            U32 rval;
            if ( ((U32)(prefixStartIndex - repIndex) >= 4) /* intentional underflow */
                 & (offset_1 > 0) ) {
                rval = MEM_read32(repBase + repIndex);
            } else {
                rval = MEM_read32(ip2) ^ 1; /* guaranteed to not match. */
            }

            /* write back hash table entry */
            current0 = (U32)(ip0 - base);
            hashTable[hash0] = current0;

            /* check repcode at ip[2] */
            if (MEM_read32(ip2) == rval) {
                ip0 = ip2;
                match0 = repBase + repIndex;
                matchEnd = repIndex < prefixStartIndex ? dictEnd : iend;
                assert((match0 != prefixStart) & (match0 != dictStart));
                mLength = ip0[-1] == match0[-1];
                ip0 -= mLength;
                match0 -= mLength;
                offcode = REPCODE1_TO_OFFBASE;
                mLength += 4;
                goto _match;
        }   }

        {   /* load match for ip[0] */
            U32 const mval = idx >= dictStartIndex ?
                    MEM_read32(idxBase + idx) :
                    MEM_read32(ip0) ^ 1; /* guaranteed not to match */

            /* check match at ip[0] */
            if (MEM_read32(ip0) == mval) {
                /* found a match! */
                goto _offset;
        }   }

        /* lookup ip[1] */
        idx = hashTable[hash1];
        idxBase = idx < prefixStartIndex ? dictBase : base;

        /* hash ip[2] */
        hash0 = hash1;
        hash1 = ZSTD_hashPtr(ip2, hlog, mls);

        /* advance to next positions */
        ip0 = ip1;
        ip1 = ip2;
        ip2 = ip3;

        /* write back hash table entry */
        current0 = (U32)(ip0 - base);
        hashTable[hash0] = current0;

        {   /* load match for ip[0] */
            U32 const mval = idx >= dictStartIndex ?
                    MEM_read32(idxBase + idx) :
                    MEM_read32(ip0) ^ 1; /* guaranteed not to match */

            /* check match at ip[0] */
            if (MEM_read32(ip0) == mval) {
                /* found a match! */
                goto _offset;
        }   }

        /* lookup ip[1] */
        idx = hashTable[hash1];
        idxBase = idx < prefixStartIndex ? dictBase : base;

        /* hash ip[2] */
        hash0 = hash1;
        hash1 = ZSTD_hashPtr(ip2, hlog, mls);

        /* advance to next positions */
        ip0 = ip1;
        ip1 = ip2;
        ip2 = ip0 + step;
        ip3 = ip1 + step;

        /* calculate step */
        if (ip2 >= nextStep) {
            step++;
            PREFETCH_L1(ip1 + 64);
            PREFETCH_L1(ip1 + 128);
            nextStep += kStepIncr;
        }
    } while (ip3 < ilimit);

_cleanup:
    /* Note that there are probably still a couple positions we could search.
     * However, it seems to be a meaningful performance hit to try to search
     * them. So let's not. */

    /* If offset_1 started invalid (offsetSaved1 != 0) and became valid (offset_1 != 0),
     * rotate saved offsets. See comment in ZSTD_compressBlock_fast_noDict for more context. */
    offsetSaved2 = ((offsetSaved1 != 0) && (offset_1 != 0)) ? offsetSaved1 : offsetSaved2;

    /* save reps for next block */
    rep[0] = offset_1 ? offset_1 : offsetSaved1;
    rep[1] = offset_2 ? offset_2 : offsetSaved2;

    /* Return the last literals size */
    return (size_t)(iend - anchor);

_offset: /* Requires: ip0, idx, idxBase */

    /* Compute the offset code. */
    {   U32 const offset = current0 - idx;
        const BYTE* const lowMatchPtr = idx < prefixStartIndex ? dictStart : prefixStart;
        matchEnd = idx < prefixStartIndex ? dictEnd : iend;
        match0 = idxBase + idx;
        offset_2 = offset_1;
        offset_1 = offset;
        offcode = OFFSET_TO_OFFBASE(offset);
        mLength = 4;

        /* Count the backwards match length. */
        while (((ip0>anchor) & (match0>lowMatchPtr)) && (ip0[-1] == match0[-1])) {
            ip0--;
            match0--;
            mLength++;
    }   }

_match: /* Requires: ip0, match0, offcode, matchEnd */

    /* Count the forward length. */
    assert(matchEnd != 0);
    mLength += ZSTD_count_2segments(ip0 + mLength, match0 + mLength, iend, matchEnd, prefixStart);

    ZSTD_storeSeq(seqStore, (size_t)(ip0 - anchor), anchor, iend, offcode, mLength);

    ip0 += mLength;
    anchor = ip0;

    /* write next hash table entry */
    if (ip1 < ip0) {
        hashTable[hash1] = (U32)(ip1 - base);
    }

    /* Fill table and check for immediate repcode. */
    if (ip0 <= ilimit) {
        /* Fill Table */
        assert(base+current0+2 > istart);  /* check base overflow */
        hashTable[ZSTD_hashPtr(base+current0+2, hlog, mls)] = current0+2;  /* here because current+2 could be > iend-8 */
        hashTable[ZSTD_hashPtr(ip0-2, hlog, mls)] = (U32)(ip0-2-base);

        while (ip0 <= ilimit) {
            U32 const repIndex2 = (U32)(ip0-base) - offset_2;
            const BYTE* const repMatch2 = repIndex2 < prefixStartIndex ? dictBase + repIndex2 : base + repIndex2;
            if ( (((U32)((prefixStartIndex-1) - repIndex2) >= 3) & (offset_2 > 0))  /* intentional underflow */
                 && (MEM_read32(repMatch2) == MEM_read32(ip0)) ) {
                const BYTE* const repEnd2 = repIndex2 < prefixStartIndex ? dictEnd : iend;
                size_t const repLength2 = ZSTD_count_2segments(ip0+4, repMatch2+4, iend, repEnd2, prefixStart) + 4;
                { U32 const tmpOffset = offset_2; offset_2 = offset_1; offset_1 = tmpOffset; }  /* swap offset_2 <=> offset_1 */
                ZSTD_storeSeq(seqStore, 0 /*litlen*/, anchor, iend, REPCODE1_TO_OFFBASE, repLength2);
                hashTable[ZSTD_hashPtr(ip0, hlog, mls)] = (U32)(ip0-base);
                ip0 += repLength2;
                anchor = ip0;
                continue;
            }
            break;
    }   }

    goto _start;
}